

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp6.c
# Opt level: O2

void fp6_mul_sparse2(fp6_struct_st *rop,fp6_struct_st *op1,fp6_struct_st *op2,ATE_CTX *ctx)

{
  fp2_struct_st *rop_00;
  fp_struct_st *p;
  fp2_t tmp4;
  fp2_t tmp2;
  fp2_t tmp1;
  fp2_t tmp5;
  fp2_struct_st local_138;
  fp2_struct_st local_f8;
  fp2_struct_st local_b8;
  fp2_struct_st local_78;
  
  fp2_mul(&local_f8,op1->m_b,op2->m_b,ctx);
  fp2_mul(&local_b8,op1->m_c,op2->m_c,ctx);
  p = ctx->p;
  fp2_add(&local_138,op1->m_b,op1->m_c,p);
  fp2_add(&local_78,op2->m_b,op2->m_c,p);
  rop_00 = rop->m_b;
  fp2_mul(rop_00,&local_138,&local_78,ctx);
  fp2_sub(rop_00,rop_00,&local_b8,p);
  fp2_sub(rop_00,rop_00,&local_f8,p);
  fp2_set(rop->m_a,&local_f8);
  fp2_set(rop->m_c,&local_b8);
  return;
}

Assistant:

void fp6_mul_sparse2(fp6_t rop, const fp6_t op1, const fp6_t op2, const ATE_CTX *ctx)
{
    fp2_t tmp1, tmp2, tmp4, tmp5; // Needed for intermediary values

    fp2_mul(tmp2, op1->m_b, op2->m_b, ctx);
    fp2_mul(tmp1, op1->m_c, op2->m_c, ctx);

    fp2_add(tmp4, op1->m_b, op1->m_c, ctx->p);
    fp2_add(tmp5, op2->m_b, op2->m_c, ctx->p);
    fp2_mul(rop->m_b, tmp4, tmp5, ctx);
    fp2_sub(rop->m_b, rop->m_b, tmp1, ctx->p);
    fp2_sub(rop->m_b, rop->m_b, tmp2, ctx->p);

    fp2_set(rop->m_a, tmp2);
    fp2_set(rop->m_c, tmp1);
}